

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLES2Loader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  bool local_19;
  GLADloadproc load_local;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      find_coreGLES2();
      load_GL_ES_VERSION_2_0(load);
      load_GL_ES_VERSION_3_0(load);
      load_GL_ES_VERSION_3_1(load);
      load_GL_ES_VERSION_3_2(load);
      iVar1 = find_extensionsGLES2();
      if (iVar1 == 0) {
        load_local._4_4_ = 0;
      }
      else {
        load_GL_AMD_framebuffer_multisample_advanced(load);
        load_GL_AMD_performance_monitor(load);
        load_GL_ANGLE_framebuffer_blit(load);
        load_GL_ANGLE_framebuffer_multisample(load);
        load_GL_ANGLE_instanced_arrays(load);
        load_GL_ANGLE_translated_shader_source(load);
        load_GL_APPLE_copy_texture_levels(load);
        load_GL_APPLE_framebuffer_multisample(load);
        load_GL_APPLE_sync(load);
        load_GL_EXT_EGL_image_storage(load);
        load_GL_EXT_base_instance(load);
        load_GL_EXT_blend_func_extended(load);
        load_GL_EXT_blend_minmax(load);
        load_GL_EXT_buffer_storage(load);
        load_GL_EXT_clear_texture(load);
        load_GL_EXT_clip_control(load);
        load_GL_EXT_copy_image(load);
        load_GL_EXT_debug_label(load);
        load_GL_EXT_debug_marker(load);
        load_GL_EXT_discard_framebuffer(load);
        load_GL_EXT_disjoint_timer_query(load);
        load_GL_EXT_draw_buffers(load);
        load_GL_EXT_draw_buffers_indexed(load);
        load_GL_EXT_draw_elements_base_vertex(load);
        load_GL_EXT_draw_instanced(load);
        load_GL_EXT_draw_transform_feedback(load);
        load_GL_EXT_external_buffer(load);
        load_GL_EXT_geometry_shader(load);
        load_GL_EXT_instanced_arrays(load);
        load_GL_EXT_map_buffer_range(load);
        load_GL_EXT_memory_object(load);
        load_GL_EXT_memory_object_fd(load);
        load_GL_EXT_memory_object_win32(load);
        load_GL_EXT_multi_draw_arrays(load);
        load_GL_EXT_multi_draw_indirect(load);
        load_GL_EXT_multisampled_render_to_texture(load);
        load_GL_EXT_multiview_draw_buffers(load);
        load_GL_EXT_occlusion_query_boolean(load);
        load_GL_EXT_polygon_offset_clamp(load);
        load_GL_EXT_primitive_bounding_box(load);
        load_GL_EXT_raster_multisample(load);
        load_GL_EXT_robustness(load);
        load_GL_EXT_semaphore(load);
        load_GL_EXT_semaphore_fd(load);
        load_GL_EXT_semaphore_win32(load);
        load_GL_EXT_separate_shader_objects(load);
        load_GL_EXT_shader_framebuffer_fetch_non_coherent(load);
        load_GL_EXT_shader_pixel_local_storage2(load);
        load_GL_EXT_sparse_texture(load);
        load_GL_EXT_tessellation_shader(load);
        load_GL_EXT_texture_border_clamp(load);
        load_GL_EXT_texture_buffer(load);
        load_GL_EXT_texture_storage(load);
        load_GL_EXT_texture_view(load);
        load_GL_EXT_win32_keyed_mutex(load);
        load_GL_EXT_window_rectangles(load);
        load_GL_IMG_bindless_texture(load);
        load_GL_IMG_framebuffer_downsample(load);
        load_GL_IMG_multisampled_render_to_texture(load);
        load_GL_INTEL_framebuffer_CMAA(load);
        load_GL_INTEL_performance_query(load);
        load_GL_KHR_blend_equation_advanced(load);
        load_GL_KHR_debug(load);
        load_GL_KHR_parallel_shader_compile(load);
        load_GL_KHR_robustness(load);
        load_GL_MESA_framebuffer_flip_y(load);
        load_GL_NV_bindless_texture(load);
        load_GL_NV_blend_equation_advanced(load);
        load_GL_NV_clip_space_w_scaling(load);
        load_GL_NV_conditional_render(load);
        load_GL_NV_conservative_raster(load);
        load_GL_NV_conservative_raster_pre_snap_triangles(load);
        load_GL_NV_copy_buffer(load);
        load_GL_NV_coverage_sample(load);
        load_GL_NV_draw_buffers(load);
        load_GL_NV_draw_instanced(load);
        load_GL_NV_draw_vulkan_image(load);
        load_GL_NV_fence(load);
        load_GL_NV_fragment_coverage_to_color(load);
        load_GL_NV_framebuffer_blit(load);
        load_GL_NV_framebuffer_mixed_samples(load);
        load_GL_NV_framebuffer_multisample(load);
        load_GL_NV_gpu_shader5(load);
        load_GL_NV_instanced_arrays(load);
        load_GL_NV_internalformat_sample_query(load);
        load_GL_NV_memory_attachment(load);
        load_GL_NV_memory_object_sparse(load);
        load_GL_NV_mesh_shader(load);
        load_GL_NV_non_square_matrices(load);
        load_GL_NV_path_rendering(load);
        load_GL_NV_polygon_mode(load);
        load_GL_NV_read_buffer(load);
        load_GL_NV_sample_locations(load);
        load_GL_NV_scissor_exclusive(load);
        load_GL_NV_shading_rate_image(load);
        load_GL_NV_timeline_semaphore(load);
        load_GL_NV_viewport_array(load);
        load_GL_NV_viewport_swizzle(load);
        load_GL_OES_EGL_image(load);
        load_GL_OES_copy_image(load);
        load_GL_OES_draw_buffers_indexed(load);
        load_GL_OES_draw_elements_base_vertex(load);
        load_GL_OES_geometry_shader(load);
        load_GL_OES_get_program_binary(load);
        load_GL_OES_mapbuffer(load);
        load_GL_OES_primitive_bounding_box(load);
        load_GL_OES_sample_shading(load);
        load_GL_OES_tessellation_shader(load);
        load_GL_OES_texture_3D(load);
        load_GL_OES_texture_border_clamp(load);
        load_GL_OES_texture_buffer(load);
        load_GL_OES_texture_storage_multisample_2d_array(load);
        load_GL_OES_texture_view(load);
        load_GL_OES_vertex_array_object(load);
        load_GL_OES_viewport_array(load);
        load_GL_OVR_multiview(load);
        load_GL_OVR_multiview_multisampled_render_to_texture(load);
        load_GL_QCOM_alpha_test(load);
        load_GL_QCOM_driver_control(load);
        load_GL_QCOM_extended_get(load);
        load_GL_QCOM_extended_get2(load);
        load_GL_QCOM_frame_extrapolation(load);
        load_GL_QCOM_framebuffer_foveated(load);
        load_GL_QCOM_motion_estimation(load);
        load_GL_QCOM_shader_framebuffer_fetch_noncoherent(load);
        load_GL_QCOM_shading_rate(load);
        load_GL_QCOM_texture_foveated(load);
        load_GL_QCOM_tiled_rendering(load);
        local_19 = GLVersion.major != 0 || GLVersion.minor != 0;
        load_local._4_4_ = (uint)local_19;
      }
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLES2Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES2();
	load_GL_ES_VERSION_2_0(load);
	load_GL_ES_VERSION_3_0(load);
	load_GL_ES_VERSION_3_1(load);
	load_GL_ES_VERSION_3_2(load);

	if (!find_extensionsGLES2()) return 0;
	load_GL_AMD_framebuffer_multisample_advanced(load);
	load_GL_AMD_performance_monitor(load);
	load_GL_ANGLE_framebuffer_blit(load);
	load_GL_ANGLE_framebuffer_multisample(load);
	load_GL_ANGLE_instanced_arrays(load);
	load_GL_ANGLE_translated_shader_source(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_sync(load);
	load_GL_EXT_EGL_image_storage(load);
	load_GL_EXT_base_instance(load);
	load_GL_EXT_blend_func_extended(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_EXT_buffer_storage(load);
	load_GL_EXT_clear_texture(load);
	load_GL_EXT_clip_control(load);
	load_GL_EXT_copy_image(load);
	load_GL_EXT_debug_label(load);
	load_GL_EXT_debug_marker(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_EXT_disjoint_timer_query(load);
	load_GL_EXT_draw_buffers(load);
	load_GL_EXT_draw_buffers_indexed(load);
	load_GL_EXT_draw_elements_base_vertex(load);
	load_GL_EXT_draw_instanced(load);
	load_GL_EXT_draw_transform_feedback(load);
	load_GL_EXT_external_buffer(load);
	load_GL_EXT_geometry_shader(load);
	load_GL_EXT_instanced_arrays(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_EXT_memory_object(load);
	load_GL_EXT_memory_object_fd(load);
	load_GL_EXT_memory_object_win32(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_EXT_multi_draw_indirect(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_multiview_draw_buffers(load);
	load_GL_EXT_occlusion_query_boolean(load);
	load_GL_EXT_polygon_offset_clamp(load);
	load_GL_EXT_primitive_bounding_box(load);
	load_GL_EXT_raster_multisample(load);
	load_GL_EXT_robustness(load);
	load_GL_EXT_semaphore(load);
	load_GL_EXT_semaphore_fd(load);
	load_GL_EXT_semaphore_win32(load);
	load_GL_EXT_separate_shader_objects(load);
	load_GL_EXT_shader_framebuffer_fetch_non_coherent(load);
	load_GL_EXT_shader_pixel_local_storage2(load);
	load_GL_EXT_sparse_texture(load);
	load_GL_EXT_tessellation_shader(load);
	load_GL_EXT_texture_border_clamp(load);
	load_GL_EXT_texture_buffer(load);
	load_GL_EXT_texture_storage(load);
	load_GL_EXT_texture_view(load);
	load_GL_EXT_win32_keyed_mutex(load);
	load_GL_EXT_window_rectangles(load);
	load_GL_IMG_bindless_texture(load);
	load_GL_IMG_framebuffer_downsample(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_INTEL_framebuffer_CMAA(load);
	load_GL_INTEL_performance_query(load);
	load_GL_KHR_blend_equation_advanced(load);
	load_GL_KHR_debug(load);
	load_GL_KHR_parallel_shader_compile(load);
	load_GL_KHR_robustness(load);
	load_GL_MESA_framebuffer_flip_y(load);
	load_GL_NV_bindless_texture(load);
	load_GL_NV_blend_equation_advanced(load);
	load_GL_NV_clip_space_w_scaling(load);
	load_GL_NV_conditional_render(load);
	load_GL_NV_conservative_raster(load);
	load_GL_NV_conservative_raster_pre_snap_triangles(load);
	load_GL_NV_copy_buffer(load);
	load_GL_NV_coverage_sample(load);
	load_GL_NV_draw_buffers(load);
	load_GL_NV_draw_instanced(load);
	load_GL_NV_draw_vulkan_image(load);
	load_GL_NV_fence(load);
	load_GL_NV_fragment_coverage_to_color(load);
	load_GL_NV_framebuffer_blit(load);
	load_GL_NV_framebuffer_mixed_samples(load);
	load_GL_NV_framebuffer_multisample(load);
	load_GL_NV_gpu_shader5(load);
	load_GL_NV_instanced_arrays(load);
	load_GL_NV_internalformat_sample_query(load);
	load_GL_NV_memory_attachment(load);
	load_GL_NV_memory_object_sparse(load);
	load_GL_NV_mesh_shader(load);
	load_GL_NV_non_square_matrices(load);
	load_GL_NV_path_rendering(load);
	load_GL_NV_polygon_mode(load);
	load_GL_NV_read_buffer(load);
	load_GL_NV_sample_locations(load);
	load_GL_NV_scissor_exclusive(load);
	load_GL_NV_shading_rate_image(load);
	load_GL_NV_timeline_semaphore(load);
	load_GL_NV_viewport_array(load);
	load_GL_NV_viewport_swizzle(load);
	load_GL_OES_EGL_image(load);
	load_GL_OES_copy_image(load);
	load_GL_OES_draw_buffers_indexed(load);
	load_GL_OES_draw_elements_base_vertex(load);
	load_GL_OES_geometry_shader(load);
	load_GL_OES_get_program_binary(load);
	load_GL_OES_mapbuffer(load);
	load_GL_OES_primitive_bounding_box(load);
	load_GL_OES_sample_shading(load);
	load_GL_OES_tessellation_shader(load);
	load_GL_OES_texture_3D(load);
	load_GL_OES_texture_border_clamp(load);
	load_GL_OES_texture_buffer(load);
	load_GL_OES_texture_storage_multisample_2d_array(load);
	load_GL_OES_texture_view(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_OES_viewport_array(load);
	load_GL_OVR_multiview(load);
	load_GL_OVR_multiview_multisampled_render_to_texture(load);
	load_GL_QCOM_alpha_test(load);
	load_GL_QCOM_driver_control(load);
	load_GL_QCOM_extended_get(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_QCOM_frame_extrapolation(load);
	load_GL_QCOM_framebuffer_foveated(load);
	load_GL_QCOM_motion_estimation(load);
	load_GL_QCOM_shader_framebuffer_fetch_noncoherent(load);
	load_GL_QCOM_shading_rate(load);
	load_GL_QCOM_texture_foveated(load);
	load_GL_QCOM_tiled_rendering(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}